

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::ExceptionTranslatorRegistry::translateActiveException_abi_cxx11_
          (ExceptionTranslatorRegistry *this)

{
  bool bVar1;
  string *in_RDI;
  TestFailureException *anon_var_0;
  TestSkipException *anon_var_0_1;
  exception *ex;
  string *msg;
  char *msg_1;
  exception_ptr *in_stack_ffffffffffffff20;
  allocator<char> *in_stack_ffffffffffffff50;
  allocator<char> *__s;
  string *translators;
  allocator<char> local_21;
  exception_ptr local_20;
  exception_ptr local_18 [3];
  
  translators = in_RDI;
  std::current_exception();
  std::__exception_ptr::exception_ptr::exception_ptr(&local_20,(nullptr_t)0x0);
  bVar1 = std::__exception_ptr::operator==(local_18,&local_20);
  std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_ffffffffffffff20);
  std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_ffffffffffffff20);
  if (bVar1) {
    __s = &local_21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,in_stack_ffffffffffffff50)
    ;
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    (anonymous_namespace)::tryTranslators_abi_cxx11_
              ((vector<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>,_std::allocator<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>_>_>
                *)translators);
  }
  return translators;
}

Assistant:

std::string ExceptionTranslatorRegistry::translateActiveException() const {
        // Compiling a mixed mode project with MSVC means that CLR
        // exceptions will be caught in (...) as well. However, these do
        // do not fill-in std::current_exception and thus lead to crash
        // when attempting rethrow.
        // /EHa switch also causes structured exceptions to be caught
        // here, but they fill-in current_exception properly, so
        // at worst the output should be a little weird, instead of
        // causing a crash.
        if ( std::current_exception() == nullptr ) {
            return "Non C++ exception. Possibly a CLR exception.";
        }

        // First we try user-registered translators. If none of them can
        // handle the exception, it will be rethrown handled by our defaults.
        try {
            return tryTranslators(m_translators);
        }
        // To avoid having to handle TFE explicitly everywhere, we just
        // rethrow it so that it goes back up the caller.
        catch( TestFailureException& ) {
            std::rethrow_exception(std::current_exception());
        }
        catch( TestSkipException& ) {
            std::rethrow_exception(std::current_exception());
        }
        catch( std::exception const& ex ) {
            return ex.what();
        }
        catch( std::string const& msg ) {
            return msg;
        }
        catch( const char* msg ) {
            return msg;
        }
        catch(...) {
            return "Unknown exception";
        }
    }